

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ccall.c
# Opt level: O1

void ccall_classify_ct(CTState *cts,CType *ct,int *rcl,CTSize ofs)

{
  CTSize CVar1;
  CType *pCVar2;
  CTInfo CVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = ct->info >> 0x1c;
  if (uVar4 != 1) {
    if (uVar4 == 3) {
      pCVar2 = cts->tab;
      CVar3 = ct->info;
      uVar4 = ct->size;
      if (uVar4 != 0) {
        CVar1 = pCVar2[(ushort)CVar3].size;
        uVar5 = 0;
        do {
          ccall_classify_ct(cts,pCVar2 + (ushort)CVar3,rcl,ofs + uVar5);
          uVar5 = uVar5 + CVar1;
        } while (uVar5 < uVar4);
      }
    }
    else {
      uVar4 = 4;
      if ((ct->size - 1 & ofs) == 0) {
        uVar4 = ((ct->info & 0xf4000000) == 0x4000000) + 1;
      }
      rcl[7 < ofs] = rcl[7 < ofs] | uVar4;
    }
    return;
  }
  ccall_classify_struct(cts,ct,rcl,ofs);
  return;
}

Assistant:

static void ccall_classify_ct(CTState *cts, CType *ct, int *rcl, CTSize ofs)
{
  if (ctype_isarray(ct->info)) {
    CType *cct = ctype_rawchild(cts, ct);
    CTSize eofs, esz = cct->size, asz = ct->size;
    for (eofs = 0; eofs < asz; eofs += esz)
      ccall_classify_ct(cts, cct, rcl, ofs+eofs);
  } else if (ctype_isstruct(ct->info)) {
    ccall_classify_struct(cts, ct, rcl, ofs);
  } else {
    int cl = ctype_isfp(ct->info) ? CCALL_RCL_SSE : CCALL_RCL_INT;
    lua_assert(ctype_hassize(ct->info));
    if ((ofs & (ct->size-1))) cl = CCALL_RCL_MEM;  /* Unaligned. */
    rcl[(ofs >= 8)] |= cl;
  }
}